

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streambuf.cpp
# Opt level: O1

void __thiscall
booster::streambuf::device
          (streambuf *this,
          unique_ptr<booster::io_device,_std::default_delete<booster::io_device>_> *d)

{
  io_device *piVar1;
  io_device *piVar2;
  
  (**(code **)(*(long *)this + 0x30))();
  piVar1 = (this->device_unique_ptr_)._M_t.
           super___uniq_ptr_impl<booster::io_device,_std::default_delete<booster::io_device>_>._M_t.
           super__Tuple_impl<0UL,_booster::io_device_*,_std::default_delete<booster::io_device>_>.
           super__Head_base<0UL,_booster::io_device_*,_false>._M_head_impl;
  (this->device_unique_ptr_)._M_t.
  super___uniq_ptr_impl<booster::io_device,_std::default_delete<booster::io_device>_>._M_t.
  super__Tuple_impl<0UL,_booster::io_device_*,_std::default_delete<booster::io_device>_>.
  super__Head_base<0UL,_booster::io_device_*,_false>._M_head_impl = (io_device *)0x0;
  this->device_ = (io_device *)0x0;
  if (piVar1 != (io_device *)0x0) {
    (*piVar1->_vptr_io_device[4])();
  }
  piVar1 = (d->_M_t).
           super___uniq_ptr_impl<booster::io_device,_std::default_delete<booster::io_device>_>._M_t.
           super__Tuple_impl<0UL,_booster::io_device_*,_std::default_delete<booster::io_device>_>.
           super__Head_base<0UL,_booster::io_device_*,_false>._M_head_impl;
  (d->_M_t).super___uniq_ptr_impl<booster::io_device,_std::default_delete<booster::io_device>_>._M_t
  .super__Tuple_impl<0UL,_booster::io_device_*,_std::default_delete<booster::io_device>_>.
  super__Head_base<0UL,_booster::io_device_*,_false>._M_head_impl = (io_device *)0x0;
  piVar2 = (this->device_unique_ptr_)._M_t.
           super___uniq_ptr_impl<booster::io_device,_std::default_delete<booster::io_device>_>._M_t.
           super__Tuple_impl<0UL,_booster::io_device_*,_std::default_delete<booster::io_device>_>.
           super__Head_base<0UL,_booster::io_device_*,_false>._M_head_impl;
  (this->device_unique_ptr_)._M_t.
  super___uniq_ptr_impl<booster::io_device,_std::default_delete<booster::io_device>_>._M_t.
  super__Tuple_impl<0UL,_booster::io_device_*,_std::default_delete<booster::io_device>_>.
  super__Head_base<0UL,_booster::io_device_*,_false>._M_head_impl = piVar1;
  if (piVar2 != (io_device *)0x0) {
    (*piVar2->_vptr_io_device[4])();
  }
  this->device_ =
       (this->device_unique_ptr_)._M_t.
       super___uniq_ptr_impl<booster::io_device,_std::default_delete<booster::io_device>_>._M_t.
       super__Tuple_impl<0UL,_booster::io_device_*,_std::default_delete<booster::io_device>_>.
       super__Head_base<0UL,_booster::io_device_*,_false>._M_head_impl;
  return;
}

Assistant:

void streambuf::device(std::unique_ptr<io_device> d)
	{
		reset_device();
		device_unique_ptr_=std::move(d);
		device_ = device_unique_ptr_.get();
	}